

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetInteger64Verifier::verifyInteger4Mask
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLint reference0,
          bool enableRef0,GLint reference1,bool enableRef1,GLint reference2,bool enableRef2,
          GLint reference3,bool enableRef3)

{
  ostringstream *this_00;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  StateQueryMemoryWriteGuard<long[4]> local_218;
  undefined1 local_1b0 [384];
  
  local_218.m_postguard[2] = -0x2121212121212122;
  local_218.m_postguard[3] = -0x2121212121212122;
  local_218.m_postguard[0] = -0x2121212121212122;
  local_218.m_postguard[1] = -0x2121212121212122;
  local_218.m_value[2] = -0x2121212121212122;
  local_218.m_value[3] = -0x2121212121212122;
  local_218.m_value[0] = -0x2121212121212122;
  local_218.m_value[1] = -0x2121212121212122;
  local_218.m_preguard[2] = -0x2121212121212122;
  local_218.m_preguard[3] = -0x2121212121212122;
  local_218.m_preguard[0] = -0x2121212121212122;
  local_218.m_preguard[1] = -0x2121212121212122;
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_218.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[4]>::verifyValidity
                    (&local_218,testCtx);
  if ((bVar1) &&
     (((((enableRef0 && (local_218.m_value[0] != reference0)) ||
        ((enableRef1 && (local_218.m_value[1] != reference1)))) ||
       ((enableRef2 && (local_218.m_value[2] != reference2)))) ||
      ((enableRef3 && (local_218.m_value[3] != reference3)))))) {
    local_1b0._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected ",0x13);
    pcVar4 = "(";
    pcVar2 = "(";
    if (enableRef0) {
      pcVar2 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar2,(ulong)!enableRef0)
    ;
    std::ostream::operator<<(this_00,reference0);
    pcVar2 = ")";
    pcVar3 = ")";
    if (enableRef0) {
      pcVar3 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,(ulong)!enableRef0)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    pcVar3 = "(";
    if (enableRef1) {
      pcVar3 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,(ulong)!enableRef1)
    ;
    std::ostream::operator<<(this_00,reference1);
    pcVar3 = ")";
    if (enableRef1) {
      pcVar3 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,(ulong)!enableRef1)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    pcVar3 = "(";
    if (enableRef2) {
      pcVar3 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,(ulong)!enableRef2)
    ;
    std::ostream::operator<<(this_00,reference2);
    pcVar3 = ")";
    if (enableRef2) {
      pcVar3 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,(ulong)!enableRef2)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    if (enableRef3) {
      pcVar4 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,(ulong)!enableRef3)
    ;
    std::ostream::operator<<(this_00,reference3);
    if (enableRef3) {
      pcVar2 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar2,(ulong)!enableRef3)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyInteger4Mask (tcu::TestContext& testCtx, GLenum name, GLint reference0, bool enableRef0, GLint reference1, bool enableRef1, GLint reference2, bool enableRef2, GLint reference3, bool enableRef3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint64[4]> intVector4;
	glGetInteger64v(name, intVector4);

	if (!intVector4.verifyValidity(testCtx))
		return;

	if ((enableRef0 && (intVector4[0] != GLint64(reference0))) ||
		(enableRef1 && (intVector4[1] != GLint64(reference1))) ||
		(enableRef2 && (intVector4[2] != GLint64(reference2))) ||
		(enableRef3 && (intVector4[3] != GLint64(reference3))))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (enableRef0?"":"(") << reference0 << (enableRef0?"":")") << ", "
			<< (enableRef1?"":"(") << reference1 << (enableRef1?"":")") << ", "
			<< (enableRef2?"":"(") << reference2 << (enableRef2?"":")") << ", "
			<< (enableRef3?"":"(") << reference3 << (enableRef3?"":")")	<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}